

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QTextCharFormat>::copyAppend
          (QGenericArrayOps<QTextCharFormat> *this,qsizetype n,parameter_type t)

{
  QTextCharFormat *this_00;
  long in_RSI;
  QTextCharFormat *in_RDI;
  QTextCharFormat *data;
  long local_10;
  
  if (in_RSI != 0) {
    this_00 = QArrayDataPointer<QTextCharFormat>::begin
                        ((QArrayDataPointer<QTextCharFormat> *)0x79e303);
    local_10 = in_RSI;
    while (local_10 != 0) {
      QTextCharFormat::QTextCharFormat(this_00,in_RDI);
      in_RDI[1].super_QTextFormat.d.d.ptr =
           (QTextFormatPrivate *)
           ((long)&((in_RDI[1].super_QTextFormat.d.d.ptr)->super_QSharedData).ref.
                   super_QAtomicInteger<int>.super_QBasicAtomicInteger<int> + 1);
      local_10 = local_10 + -1;
    }
  }
  return;
}

Assistant:

void copyAppend(qsizetype n, parameter_type t)
    {
        Q_ASSERT(!this->isShared() || n == 0);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        if (!n)
            return;

        T *data = this->begin();
        while (n--) {
            new (data + this->size) T(t);
            ++this->size;
        }
    }